

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O0

thread_info_base *
asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::contains
          (thread_context *k)

{
  thread_context *in_RDI;
  context *elem;
  context *local_18;
  
  local_18 = keyword_tss_ptr::operator_cast_to_context_
                       ((keyword_tss_ptr<asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::context>
                         *)0x205825);
  while( true ) {
    if (local_18 == (context *)0x0) {
      return (thread_info_base *)0x0;
    }
    if (local_18->key_ == in_RDI) break;
    local_18 = local_18->next_;
  }
  return local_18->value_;
}

Assistant:

static Value* contains(Key* k)
  {
    context* elem = top_;
    while (elem)
    {
      if (elem->key_ == k)
        return elem->value_;
      elem = elem->next_;
    }
    return 0;
  }